

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O2

void __thiscall cornerstone::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  msg_type mVar1;
  element_type *peVar2;
  __uniq_ptr_data<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>,_true,_true>
  _Var3;
  element_type *peVar4;
  undefined8 uVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  char *pcVar9;
  iterator iVar10;
  int iVar11;
  executor exec;
  ptr<peer> p;
  ptr<req_msg> req;
  undefined1 local_108 [16];
  shared_lock<std::shared_timed_mutex> rlock;
  char local_e8 [8];
  __shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [5];
  char *local_90;
  char *local_30;
  
  peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30 = "receive an rpc error response from peer server, %s";
  pcVar9 = (char *)(**(code **)(*(long *)err + 0x10))(err);
  pcVar9 = strfmt<200>::fmt<char_const*>((strfmt<200> *)&rlock,pcVar9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&exec,pcVar9,(allocator<char> *)&req)
  ;
  (*peVar2->_vptr_logger[2])(peVar2,&exec);
  std::__cxx11::string::~string((string *)&exec);
  std::__shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>,
             &(err->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  mVar1 = ((req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_msg_base).type_;
  if ((mVar1 == sync_log_request) || (mVar1 == join_cluster_request)) {
    p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>,
               &(this->srv_to_join_).
                super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    if (mVar1 != leave_cluster_request) goto LAB_00148908;
    p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rlock._M_pm = &this->peers_lock_;
    rlock._M_owns = true;
    std::__shared_mutex_pthread::lock_shared(&(rlock._M_pm)->super___shared_timed_mutex_base);
    exec.super__Function_base._M_functor._0_4_ =
         ((req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_msg_base).dst_;
    iVar10 = std::
             _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->peers_)._M_h,(key_type_conflict *)&exec);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>.
        _M_cur != (__node_type *)0x0) {
      std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar10.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                        ._M_cur + 0x10));
    }
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&rlock);
  }
  if (p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    _Var3.
    super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>.
    _M_t.
    super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
    .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl =
         (((this->ctx_)._M_t.
           super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>.
           _M_t.
           super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
           .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_)._M_t.
         super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
    ;
    iVar11 = *(int *)((long)_Var3.
                            super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
                            .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl +
                     8);
    iVar8 = iVar11 / -2 +
            *(int *)((long)_Var3.
                           super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
                           .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl +
                    4);
    if (iVar8 < iVar11) {
      iVar8 = iVar11;
    }
    if ((p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        current_hb_interval_ < iVar8) {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rlock,"retry the request",(allocator<char> *)&exec);
      (*peVar2->_vptr_logger[2])(peVar2,&rlock);
      std::__cxx11::string::~string((string *)&rlock);
      iVar11 = (p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               rpc_backoff_ +
               (p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               current_hb_interval_;
      if ((p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          max_hb_interval_ <= iVar11) {
        iVar11 = (p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 max_hb_interval_;
      }
      (p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      current_hb_interval_ = iVar11;
      rlock._M_pm = (mutex_type *)this;
      std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *)&rlock._M_owns,
                 &p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (a_Stack_e0,
                 &req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>);
      exec.super__Function_base._M_manager = (_Manager_type)0x0;
      exec._M_invoker = (_Invoker_type)0x0;
      exec.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      exec.super__Function_base._M_functor._8_8_ = 0;
      exec.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
      _Var7._M_pi = a_Stack_e0[0]._M_refcount._M_pi;
      peVar6 = a_Stack_e0[0]._M_ptr;
      uVar5 = rlock._8_8_;
      rlock._M_owns = false;
      rlock._9_7_ = 0;
      a_Stack_e0[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(mutex_type **)exec.super__Function_base._M_functor._M_unused._0_8_ = rlock._M_pm;
      *(undefined8 *)((long)exec.super__Function_base._M_functor._M_unused._0_8_ + 8) = uVar5;
      a_Stack_e0[0]._M_ptr = (element_type *)0x0;
      *(char (*) [8])((long)exec.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_e8;
      *(element_type **)((long)exec.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = peVar6
      ;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)exec.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = _Var7._M_pi;
      exec._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_resp_handlers.cxx:460:51)>
           ::_M_invoke;
      exec.super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_resp_handlers.cxx:460:51)>
           ::_M_manager;
      handle_ext_resp_err(cornerstone::rpc_exception&)::$_0::~__0((__0 *)&rlock);
      std::make_shared<cornerstone::timer_task<void>,std::function<void()>&>
                ((function<void_()> *)local_108);
      rlock._M_pm = (mutex_type *)local_108._0_8_;
      rlock._8_8_ = local_108._8_8_;
      local_108._0_8_ = (mutex_type *)0x0;
      local_108._8_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
      peVar4 = (this->scheduler_).
               super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar4->_vptr_delayed_task_scheduler[2])
                (peVar4,&rlock,
                 (ulong)(uint)(p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->current_hb_interval_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rlock._M_owns);
      std::_Function_base::~_Function_base(&exec.super__Function_base);
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (((req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_msg_base).type_ == leave_cluster_request) {
        local_30 = "rpc failed again for the removing server (%d), will remove this server directly"
        ;
        pcVar9 = strfmt<200>::fmt<int>
                           ((strfmt<200> *)&rlock,
                            (((p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->config_).
                             super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->id_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&exec,pcVar9,(allocator<char> *)local_108);
        (*peVar2->_vptr_logger[3])(peVar2,&exec);
        std::__cxx11::string::~string((string *)&exec);
        std::__shared_mutex_pthread::lock(&(this->peers_lock_).super___shared_timed_mutex_base);
        if ((this->peers_)._M_h._M_element_count == 1) {
          rlock._M_pm = (mutex_type *)
                        CONCAT44(rlock._M_pm._4_4_,
                                 (((p.
                                    super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->config_).
                                  super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_);
          iVar10 = std::
                   _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->peers_)._M_h,(key_type_conflict *)&rlock);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_90 = "peer %d cannot be found, no action for removing";
            pcVar9 = strfmt<100>::fmt<int>
                               ((strfmt<100> *)&rlock,
                                (((p.
                                   super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->config_).
                                 super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->id_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&exec,pcVar9,(allocator<char> *)local_108);
            (*peVar2->_vptr_logger[3])(peVar2,&exec);
          }
          else {
            peer::enable_hb(*(peer **)((long)iVar10.
                                             super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                                             ._M_cur + 0x10),false);
            std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&(this->peers_)._M_h,
                    (const_iterator)
                    iVar10.
                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                    ._M_cur);
            peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_90 = "server %d is removed from cluster";
            pcVar9 = strfmt<100>::fmt<int>
                               ((strfmt<100> *)&rlock,
                                (((p.
                                   super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->config_).
                                 super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->id_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&exec,pcVar9,(allocator<char> *)local_108);
            (*peVar2->_vptr_logger[3])(peVar2,&exec);
          }
          std::__cxx11::string::~string((string *)&exec);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
        rm_srv_from_cluster(this,(((p.
                                    super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->config_).
                                  super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_);
      }
      else {
        local_30 = 
        "rpc failed again for the new coming server (%d), will stop retry for this server";
        pcVar9 = strfmt<200>::fmt<int>
                           ((strfmt<200> *)&rlock,
                            (((p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->config_).
                             super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->id_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&exec,pcVar9,(allocator<char> *)local_108);
        (*peVar2->_vptr_logger[3])(peVar2,&exec);
        std::__cxx11::string::~string((string *)&exec);
        this->config_changing_ = false;
        std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&(this->srv_to_join_).
                    super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00148908:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err)
{
    l_->debug(lstrfmt("receive an rpc error response from peer server, %s").fmt(err.what()));
    ptr<req_msg> req = err.req();
    if (req->get_type() == msg_type::sync_log_request || req->get_type() == msg_type::join_cluster_request ||
        req->get_type() == msg_type::leave_cluster_request)
    {
        ptr<peer> p;
        if (req->get_type() == msg_type::leave_cluster_request)
        {
            read_lock(peers_lock_);
            peer_itor pit = peers_.find(req->get_dst());
            if (pit != peers_.end())
            {
                p = pit->second;
            }
        }
        else
        {
            p = srv_to_join_;
        }

        if (p != nilptr)
        {
            if (p->get_current_hb_interval() >= ctx_->params_->max_hb_interval())
            {
                if (req->get_type() == msg_type::leave_cluster_request)
                {
                    l_->info(lstrfmt("rpc failed again for the removing server (%d), will remove this server directly")
                                 .fmt(p->get_id()));

                    /**
                     * In case of there are only two servers in the cluster, it safe to remove the server directly from
                     * peers as at most one config change could happen at a time prove: assume there could be two config
                     * changes at a time this means there must be a leader after previous leader offline, which is
                     * impossible (no leader could be elected after one server goes offline in case of only two servers
                     * in a cluster) so the bug https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E does not
                     * apply to cluster which only has two members
                     */
                    {
                        write_lock(peers_lock_);
                        if (peers_.size() == 1)
                        {
                            peer_itor pit = peers_.find(p->get_id());
                            if (pit != peers_.end())
                            {
                                pit->second->enable_hb(false);
                                peers_.erase(pit);
                                l_->info(sstrfmt("server %d is removed from cluster").fmt(p->get_id()));
                            }
                            else
                            {
                                l_->info(sstrfmt("peer %d cannot be found, no action for removing").fmt(p->get_id()));
                            }
                        }
                    }

                    rm_srv_from_cluster(p->get_id());
                }
                else
                {
                    l_->info(lstrfmt("rpc failed again for the new coming server (%d), will stop retry for this server")
                                 .fmt(p->get_id()));
                    config_changing_ = false;
                    srv_to_join_.reset();
                }
            }
            else
            {
                // reuse the heartbeat interval value to indicate when to stop retrying, as rpc backoff is the same
                l_->debug("retry the request");
                p->slow_down_hb();
                timer_task<void>::executor exec = [this, p, req]() mutable { this->on_retryable_req_err(p, req); };
                ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
                scheduler_->schedule(task, p->get_current_hb_interval());
            }
        }
    }
}